

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

void vorbis_deinit(stb_vorbis *p)

{
  Residue *pRVar1;
  Codebook *p_00;
  long lVar2;
  void *p_01;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  setup_free(p,p->vendor);
  for (lVar4 = 0; lVar4 < p->comment_list_length; lVar4 = lVar4 + 1) {
    setup_free(p,p->comment_list[lVar4]);
  }
  setup_free(p,p->comment_list);
  if (p->residue_config != (Residue *)0x0) {
    for (lVar4 = 0; lVar4 < p->residue_count; lVar4 = lVar4 + 1) {
      pRVar1 = p->residue_config;
      if (pRVar1[lVar4].classdata != (uint8 **)0x0) {
        for (lVar3 = 0; lVar3 < p->codebooks[pRVar1[lVar4].classbook].entries; lVar3 = lVar3 + 1) {
          setup_free(p,pRVar1[lVar4].classdata[lVar3]);
        }
        setup_free(p,pRVar1[lVar4].classdata);
      }
      setup_free(p,pRVar1[lVar4].residue_books);
    }
  }
  if (p->codebooks != (Codebook *)0x0) {
    lVar4 = 8;
    for (lVar3 = 0; p_00 = p->codebooks, lVar3 < p->codebook_count; lVar3 = lVar3 + 1) {
      setup_free(p,*(void **)((long)p_00->fast_huffman + lVar4 + -0x30));
      setup_free(p,*(void **)((long)p_00->fast_huffman + lVar4 + -0x18));
      setup_free(p,*(void **)((long)p_00->fast_huffman + lVar4 + -0x10));
      setup_free(p,*(void **)((long)p_00->fast_huffman + lVar4 + 0x7f8));
      lVar2 = *(long *)((long)&p_00->sorted_codewords + lVar4);
      p_01 = (void *)(lVar2 + -4);
      if (lVar2 == 0) {
        p_01 = (void *)0x0;
      }
      setup_free(p,p_01);
      lVar4 = lVar4 + 0x848;
    }
    setup_free(p,p_00);
  }
  setup_free(p,p->floor_config);
  setup_free(p,p->residue_config);
  if (p->mapping != (Mapping *)0x0) {
    lVar4 = 8;
    for (lVar3 = 0; lVar3 < p->mapping_count; lVar3 = lVar3 + 1) {
      setup_free(p,*(void **)(p->mapping->submap_floor + lVar4 + -0x11));
      lVar4 = lVar4 + 0x30;
    }
    setup_free(p,p->mapping);
  }
  for (uVar5 = 0; (uVar5 < 0x10 && ((long)uVar5 < (long)p->channels)); uVar5 = uVar5 + 1) {
    setup_free(p,p->channel_buffers[uVar5]);
    setup_free(p,p->previous_window[uVar5]);
    setup_free(p,p->finalY[uVar5]);
  }
  for (lVar4 = 0xb9; lVar4 != 0xbb; lVar4 = lVar4 + 1) {
    setup_free(p,*(void **)((long)p + lVar4 * 8 + -0x40));
    setup_free(p,*(void **)((long)p + lVar4 * 8 + -0x30));
    setup_free(p,*(void **)((long)p + lVar4 * 8 + -0x20));
    setup_free(p,*(void **)((long)p + lVar4 * 8 + -0x10));
    setup_free(p,*(void **)(&p->sample_rate + lVar4 * 2));
  }
  if (p->close_on_free != 0) {
    fclose((FILE *)p->f);
    return;
  }
  return;
}

Assistant:

static void vorbis_deinit(stb_vorbis *p)
{
   int i,j;

   setup_free(p, p->vendor);
   for (i=0; i < p->comment_list_length; ++i) {
      setup_free(p, p->comment_list[i]);
   }
   setup_free(p, p->comment_list);

   if (p->residue_config) {
      for (i=0; i < p->residue_count; ++i) {
         Residue *r = p->residue_config+i;
         if (r->classdata) {
            for (j=0; j < p->codebooks[r->classbook].entries; ++j)
               setup_free(p, r->classdata[j]);
            setup_free(p, r->classdata);
         }
         setup_free(p, r->residue_books);
      }
   }

   if (p->codebooks) {
      CHECK(p);
      for (i=0; i < p->codebook_count; ++i) {
         Codebook *c = p->codebooks + i;
         setup_free(p, c->codeword_lengths);
         setup_free(p, c->multiplicands);
         setup_free(p, c->codewords);
         setup_free(p, c->sorted_codewords);
         // c->sorted_values[-1] is the first entry in the array
         setup_free(p, c->sorted_values ? c->sorted_values-1 : NULL);
      }
      setup_free(p, p->codebooks);
   }
   setup_free(p, p->floor_config);
   setup_free(p, p->residue_config);
   if (p->mapping) {
      for (i=0; i < p->mapping_count; ++i)
         setup_free(p, p->mapping[i].chan);
      setup_free(p, p->mapping);
   }
   CHECK(p);
   for (i=0; i < p->channels && i < STB_VORBIS_MAX_CHANNELS; ++i) {
      setup_free(p, p->channel_buffers[i]);
      setup_free(p, p->previous_window[i]);
      #ifdef STB_VORBIS_NO_DEFER_FLOOR
      setup_free(p, p->floor_buffers[i]);
      #endif
      setup_free(p, p->finalY[i]);
   }
   for (i=0; i < 2; ++i) {
      setup_free(p, p->A[i]);
      setup_free(p, p->B[i]);
      setup_free(p, p->C[i]);
      setup_free(p, p->window[i]);
      setup_free(p, p->bit_reverse[i]);
   }
   #ifndef STB_VORBIS_NO_STDIO
   if (p->close_on_free) fclose(p->f);
   #endif
}